

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O3

void uncreate_artifacts(chunk_conflict *c)

{
  int iVar1;
  loc grid;
  object *poVar2;
  int y;
  int iVar3;
  
  iVar3 = c->height;
  if (0 < iVar3) {
    iVar1 = c->width;
    y = 0;
    do {
      if (0 < iVar1) {
        iVar3 = 0;
        do {
          grid = (loc)loc(iVar3,y);
          for (poVar2 = square_object(c,grid); poVar2 != (object *)0x0; poVar2 = poVar2->next) {
            if (poVar2->artifact != (artifact *)0x0) {
              mark_artifact_created(poVar2->artifact,false);
            }
          }
          iVar3 = iVar3 + 1;
          iVar1 = c->width;
        } while (iVar3 < iVar1);
        iVar3 = c->height;
      }
      y = y + 1;
    } while (y < iVar3);
  }
  return;
}

Assistant:

void uncreate_artifacts(struct chunk *c)
{
	int y, x;

	/* Also mark created artifacts as not created ... */
	for (y = 0; y < c->height; y++) {
		for (x = 0; x < c->width; x++) {
			struct loc grid = loc(x, y);
			struct object *obj = square_object(c, grid);
			while (obj) {
				if (obj->artifact) {
					mark_artifact_created(obj->artifact, false);
				}
				obj = obj->next;
			}
		}
	}
}